

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvahammer.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t b;
  uint32_t a;
  int cnum;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _cnum = argv;
  argv_local._0_4_ = argc;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    b = 0;
    while (a = getopt((int)argv_local,_cnum,"c:"), a != 0xffffffff) {
      if (a == 99) {
        __isoc99_sscanf(_optarg,"%d",&b);
      }
    }
    if ((int)b < nva_cardsnum) {
      if (_optind < (int)argv_local) {
        if (_optind + 1 < (int)argv_local) {
          __isoc99_sscanf(_cnum[_optind],"%x",&local_24);
          __isoc99_sscanf(_cnum[_optind + 1],"%x",&local_28);
          do {
            nva_wr32(b,local_24,local_28);
          } while( true );
        }
        fprintf(_stderr,"No value specified.\n");
      }
      else {
        fprintf(_stderr,"No address specified.\n");
      }
    }
    else if (nva_cardsnum == 0) {
      fprintf(_stderr,"No cards found.\n");
    }
    else {
      fprintf(_stderr,"No such card.\n");
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	uint32_t a, b;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	if (optind + 1 >= argc) {
		fprintf (stderr, "No value specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	sscanf (argv[optind + 1], "%x", &b);
	while (1)
		nva_wr32(cnum, a, b);
	return 0;
}